

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxHnilWarns(void *arkode_mem,int mxhnil)

{
  int in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxHnilWarns","arkode_mem = NULL illegal.")
    ;
    local_4 = -0x15;
  }
  else {
    if (in_ESI == 0) {
      *(undefined4 *)(in_RDI + 0x1c0) = 10;
    }
    else {
      *(int *)(in_RDI + 0x1c0) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxHnilWarns(void *arkode_mem, int mxhnil)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxHnilWarns", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing mxhnil=0 sets the default, otherwise use input. */
  if (mxhnil == 0) {
    ark_mem->mxhnil = 10;
  } else {
    ark_mem->mxhnil = mxhnil;
  }

  return(ARK_SUCCESS);
}